

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

void doh_probe_done(Curl_easy *data,Curl_easy *doh,CURLcode result)

{
  doh_probes *pdVar1;
  void *pvVar2;
  char *pcVar3;
  size_t len;
  int local_34;
  int i;
  doh_request *doh_req;
  doh_probes *dohp;
  CURLcode result_local;
  Curl_easy *doh_local;
  Curl_easy *data_local;
  
  pdVar1 = (data->state).async.doh;
  if (pdVar1 != (doh_probes *)0x0) {
    pvVar2 = Curl_meta_get(doh,"ezm:doh-p");
    local_34 = 0;
    while ((local_34 < 2 && (pdVar1->probe_resp[local_34].probe_mid != doh->mid))) {
      local_34 = local_34 + 1;
    }
    if (local_34 < 2) {
      pdVar1->pending = pdVar1->pending - 1;
      if (((doh != (Curl_easy *)0x0) && ((*(ulong *)&(doh->set).field_0x89c >> 0x1e & 1) != 0)) &&
         (((doh->state).feat == (curl_trc_feat *)0x0 || (0 < ((doh->state).feat)->log_level)))) {
        Curl_infof(doh,"a DoH request is completed, %u to go",(ulong)pdVar1->pending);
      }
      pdVar1->probe_resp[local_34].result = result;
      dohp._4_4_ = result;
      if (pvVar2 != (void *)0x0) {
        if (result == CURLE_OK) {
          pdVar1->probe_resp[local_34].dnstype = *(DNStype *)((long)pvVar2 + 0x140);
          pcVar3 = Curl_dyn_ptr((dynbuf *)((long)pvVar2 + 0x118));
          len = Curl_dyn_len((dynbuf *)((long)pvVar2 + 0x118));
          dohp._4_4_ = Curl_dyn_addn(&pdVar1->probe_resp[local_34].body,pcVar3,len);
          Curl_dyn_free((dynbuf *)((long)pvVar2 + 0x118));
        }
        Curl_meta_remove(doh,"ezm:doh-p");
      }
      if ((((dohp._4_4_ != CURLE_OK) && (doh != (Curl_easy *)0x0)) &&
          ((*(ulong *)&(doh->set).field_0x89c >> 0x1e & 1) != 0)) &&
         (((doh->state).feat == (curl_trc_feat *)0x0 || (0 < ((doh->state).feat)->log_level)))) {
        pcVar3 = curl_easy_strerror(dohp._4_4_);
        Curl_infof(doh,"DoH request %s",pcVar3);
      }
      if (pdVar1->pending == 0) {
        Curl_expire(data,0,EXPIRE_RUN_NOW);
      }
    }
    else {
      Curl_failf(data,"unknown sub request done");
    }
  }
  return;
}

Assistant:

static void doh_probe_done(struct Curl_easy *data,
                           struct Curl_easy *doh, CURLcode result)
{
  struct doh_probes *dohp = data->state.async.doh;
  DEBUGASSERT(dohp);
  if(dohp) {
    struct doh_request *doh_req = Curl_meta_get(doh, CURL_EZM_DOH_PROBE);
    int i;

    for(i = 0; i < DOH_SLOT_COUNT; ++i) {
      if(dohp->probe_resp[i].probe_mid == doh->mid)
        break;
    }
    if(i >= DOH_SLOT_COUNT) {
      failf(data, "unknown sub request done");
      return;
    }

    dohp->pending--;
    infof(doh, "a DoH request is completed, %u to go", dohp->pending);
    dohp->probe_resp[i].result = result;
    /* We expect either the meta data still to exist or the sub request
     * to have already failed. */
    DEBUGASSERT(doh_req || result);
    if(doh_req) {
      if(!result) {
        dohp->probe_resp[i].dnstype = doh_req->dnstype;
        result = Curl_dyn_addn(&dohp->probe_resp[i].body,
                               Curl_dyn_ptr(&doh_req->resp_body),
                               Curl_dyn_len(&doh_req->resp_body));
        Curl_dyn_free(&doh_req->resp_body);
      }
      Curl_meta_remove(doh, CURL_EZM_DOH_PROBE);
    }

    if(result)
      infof(doh, "DoH request %s", curl_easy_strerror(result));

    if(!dohp->pending) {
      /* DoH completed, run the transfer picking up the results */
      Curl_expire(data, 0, EXPIRE_RUN_NOW);
    }
  }
}